

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_false,_false>::insert_tail_(DaTrie<false,_false,_false> *this,Query *query)

{
  pointer *ppcVar1;
  pointer pBVar2;
  iterator iVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  char local_2a;
  char local_29;
  
  if (query->is_finished_ == true) {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[query->node_pos_] =
         (Bc)((ulong)pBVar2[query->node_pos_] & 0xffffffff00000000 | (ulong)query->value_ |
             0x80000000);
  }
  else {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[query->node_pos_] =
         (Bc)((ulong)(uint)(*(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start) |
              (ulong)pBVar2[query->node_pos_] & 0xffffffff00000000 | 0x80000000);
    if (query->is_finished_ == false) {
      do {
        local_29 = query->key_[query->pos_];
        iVar3._M_current =
             (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&this->tail_,iVar3,&local_29);
        }
        else {
          *iVar3._M_current = local_29;
          ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        uVar4 = query->pos_;
        query->pos_ = uVar4 + 1;
        bVar6 = query->key_[uVar4] == '\0';
        query->is_finished_ = bVar6;
      } while (!bVar6);
    }
    uVar4 = query->value_;
    lVar5 = 4;
    do {
      local_2a = (char)uVar4;
      iVar3._M_current =
           (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&this->tail_,iVar3,&local_2a);
      }
      else {
        *iVar3._M_current = local_2a;
        ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      uVar4 = uVar4 >> 8;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void insert_tail_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    if (query.is_finished()) {
      bc_[query.node_pos()].set_value(query.value());
      return;
    }

    auto tail_pos = tail_size();
    bc_[query.node_pos()].set_value(tail_pos);

    while (!query.is_finished()) {
      tail_.push_back(query.label());
      query.next();
    }

    auto value = query.value();
    for (size_t i = 0; i < sizeof(uint32_t); ++i) {
      tail_.push_back(static_cast<uint8_t>(value & 0xFF));
      value >>= 8;
    }
  }